

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

OptionStatus
getOptionIndex(HighsLogOptions *report_log_options,string *name,
              vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
              HighsInt *index)

{
  pointer ppOVar1;
  pointer ppOVar2;
  __type _Var3;
  int iVar4;
  
  ppOVar1 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  ppOVar2 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  iVar4 = 0;
  while( true ) {
    *index = iVar4;
    if ((int)((ulong)((long)ppOVar1 - (long)ppOVar2) >> 3) <= iVar4) {
      highsLogUser(report_log_options,kError,"getOptionIndex: Option \"%s\" is unknown\n",
                   (name->_M_dataplus)._M_p);
      return kUnknownOption;
    }
    _Var3 = std::operator==(&(option_records->
                             super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[iVar4]->name,name);
    if (_Var3) break;
    iVar4 = *index + 1;
  }
  return kOk;
}

Assistant:

OptionStatus getOptionIndex(const HighsLogOptions& report_log_options,
                            const std::string& name,
                            const std::vector<OptionRecord*>& option_records,
                            HighsInt& index) {
  HighsInt num_options = option_records.size();
  for (index = 0; index < num_options; index++)
    if (option_records[index]->name == name) return OptionStatus::kOk;
  highsLogUser(report_log_options, HighsLogType::kError,
               "getOptionIndex: Option \"%s\" is unknown\n", name.c_str());
  return OptionStatus::kUnknownOption;
}